

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall
duckdb::DictionaryCompressionCompressState::Flush
          (DictionaryCompressionCompressState *this,bool final)

{
  __int_type _Var1;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var2;
  pointer pCVar3;
  idx_t iVar4;
  ColumnCheckpointState *pCVar5;
  undefined7 in_register_00000031;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_60;
  undefined4 local_54;
  idx_t local_50;
  BufferHandle local_48;
  
  local_54 = (undefined4)CONCAT71(in_register_00000031,final);
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  local_50 = (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).start;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  _Var1 = (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  iVar4 = Finalize(this);
  pCVar5 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  local_60._M_head_impl =
       (this->current_segment).
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&local_48,&this->current_handle);
  (*pCVar5->_vptr_ColumnCheckpointState[4])(pCVar5,&local_60,&local_48,iVar4);
  BufferHandle::~BufferHandle(&local_48);
  _Var2._M_head_impl = local_60._M_head_impl;
  if (local_60._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_60._M_head_impl);
    operator_delete(_Var2._M_head_impl);
  }
  local_60._M_head_impl = (ColumnSegment *)0x0;
  if ((char)local_54 == '\0') {
    CreateEmptySegment(this,_Var1 + local_50);
  }
  return;
}

Assistant:

void DictionaryCompressionCompressState::Flush(bool final) {
	auto next_start = current_segment->start + current_segment->count;

	auto segment_size = Finalize();
	auto &state = checkpoint_data.GetCheckpointState();
	state.FlushSegment(std::move(current_segment), std::move(current_handle), segment_size);

	if (!final) {
		CreateEmptySegment(next_start);
	}
}